

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawColumnRt4PalCommand::Execute(DrawColumnRt4PalCommand *this,DrawerThread *thread)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  long lVar7;
  uint8_t *puVar8;
  
  iVar5 = (this->super_PalRtCommand).yl;
  uVar3 = DrawerThread::count_for_thread(thread,iVar5,((this->super_PalRtCommand).yh - iVar5) + 1);
  if (0 < (int)uVar3) {
    puVar1 = (this->super_PalRtCommand)._colormap;
    iVar5 = (this->super_PalRtCommand).yl;
    iVar4 = DrawerThread::skipped_by_thread(thread,iVar5);
    puVar8 = (this->super_PalRtCommand)._destorg +
             (long)(this->super_PalRtCommand).sx + (long)(int)(&ylookup)[iVar4 + iVar5];
    puVar2 = thread->dc_temp;
    iVar5 = DrawerThread::temp_line_for_thread(thread,(this->super_PalRtCommand).yl);
    pbVar6 = puVar2 + (iVar5 << 2);
    iVar5 = thread->num_cores * (this->super_PalRtCommand)._pitch;
    if ((uVar3 & 1) != 0) {
      *puVar8 = puVar1[*pbVar6];
      puVar8[1] = puVar1[pbVar6[1]];
      puVar8[2] = puVar1[pbVar6[2]];
      puVar8[3] = puVar1[pbVar6[3]];
      pbVar6 = pbVar6 + 4;
      puVar8 = puVar8 + iVar5;
    }
    if (uVar3 != 1) {
      lVar7 = 0;
      do {
        *puVar8 = puVar1[pbVar6[lVar7 * 8]];
        puVar8[1] = puVar1[pbVar6[lVar7 * 8 + 1]];
        puVar8[2] = puVar1[pbVar6[lVar7 * 8 + 2]];
        puVar8[3] = puVar1[pbVar6[lVar7 * 8 + 3]];
        puVar8[iVar5] = puVar1[pbVar6[lVar7 * 8 + 4]];
        puVar8[iVar5 + 1] = puVar1[pbVar6[lVar7 * 8 + 5]];
        puVar8[iVar5 + 2] = puVar1[pbVar6[lVar7 * 8 + 6]];
        puVar8[iVar5 + 3] = puVar1[pbVar6[lVar7 * 8 + 7]];
        puVar8 = puVar8 + iVar5 * 2;
        lVar7 = lVar7 + 1;
      } while (uVar3 >> 1 != (uint)lVar7);
    }
  }
  return;
}

Assistant:

void DrawColumnRt4PalCommand::Execute(DrawerThread *thread)
	{
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int count;
		int pitch;

		count = yh - yl + 1;

		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		colormap = _colormap;
		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4];
		pitch = _pitch*thread->num_cores;
	
		if (count & 1) {
			dest[0] = colormap[source[0]];
			dest[1] = colormap[source[1]];
			dest[2] = colormap[source[2]];
			dest[3] = colormap[source[3]];
			source += 4;
			dest += pitch;
		}
		if (!(count >>= 1))
			return;

		do {
			dest[0] = colormap[source[0]];
			dest[1] = colormap[source[1]];
			dest[2] = colormap[source[2]];
			dest[3] = colormap[source[3]];
			dest[pitch] = colormap[source[4]];
			dest[pitch+1] = colormap[source[5]];
			dest[pitch+2] = colormap[source[6]];
			dest[pitch+3] = colormap[source[7]];
			source += 8;
			dest += pitch*2;
		} while (--count);
	}